

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_tri_projection(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *projection)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL area;
  double local_30;
  
  uVar2 = ref_node_tri_area(ref_node,nodes,&local_30);
  if (uVar2 == 0) {
    pRVar1 = ref_node->real;
    lVar3 = (long)*nodes;
    dVar4 = pRVar1[(long)nodes[1] * 0xf + 2] - xyz[2];
    dVar8 = *xyz;
    dVar7 = pRVar1[(long)nodes[2] * 0xf + 1] - xyz[1];
    dVar9 = (pRVar1 + (long)nodes[2] * 0xf + 1)[1] - xyz[2];
    dVar5 = pRVar1[(long)nodes[1] * 0xf] - dVar8;
    dVar6 = (pRVar1 + (long)nodes[1] * 0xf)[1] - xyz[1];
    dVar4 = (((dVar6 * dVar9 - dVar4 * dVar7) * (pRVar1[lVar3 * 0xf] - dVar8) -
             (dVar9 * dVar5 + -(pRVar1[(long)nodes[2] * 0xf] - dVar8) * dVar4) *
             (pRVar1[lVar3 * 0xf + 1] - xyz[1])) +
            (dVar5 * dVar7 - dVar6 * (pRVar1[(long)nodes[2] * 0xf] - dVar8)) *
            (pRVar1[lVar3 * 0xf + 2] - xyz[2])) / -6.0;
    dVar8 = local_30 * 1e+20;
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    dVar5 = dVar4;
    if (dVar4 <= -dVar4) {
      dVar5 = -dVar4;
    }
    if (dVar8 <= dVar5) {
      *projection = 0.0;
      printf("%s: %d: %s: div zero vol %.18e area %.18e\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc14,
             "ref_node_tri_projection");
      uVar2 = 4;
    }
    else {
      *projection = (dVar4 / local_30) * 3.0;
      uVar2 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc01,
           "ref_node_tri_projection",(ulong)uVar2,"area");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_projection(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *xyz, REF_DBL *projection) {
  REF_DBL area;
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL vol;
  RSS(ref_node_tri_area(ref_node, nodes, &area), "area");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = xyz;

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  vol = -(m11 - m12 + m13) / 6.0;

  if (ref_math_divisible(vol, area)) {
    *projection = 3.0 * (vol / area);
  } else {
    *projection = 0.0;
    printf("%s: %d: %s: div zero vol %.18e area %.18e\n", __FILE__, __LINE__,
           __func__, vol, area);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}